

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

void __thiscall
crnlib::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint param_3)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pdVar8 = &stats->m_p->mPeakSNR;
  dVar15 = 0.0;
  dVar16 = 0.0;
  dVar17 = 0.0;
  uVar4 = 0;
  uVar5 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar6 = 0;
  uVar9 = 0;
  dVar14 = 1000000.0;
  for (uVar7 = 0; stats->m_size != uVar7; uVar7 = uVar7 + 1) {
    uVar1 = (uVar7 & 0xffffffff) / (ulong)num_blocks_x;
    uVar2 = (uVar7 & 0xffffffff) % (ulong)num_blocks_x;
    dVar13 = *pdVar8;
    if (dVar13 < 200.0 && dVar17 < dVar13) {
      uVar5 = uVar2;
      dVar17 = dVar13;
      uVar4 = uVar1;
    }
    if (dVar13 < dVar14) {
      uVar11 = uVar2;
      uVar10 = uVar1;
    }
    if (200.0 <= dVar13) {
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    else {
      dVar15 = dVar15 + dVar13 * dVar13;
      dVar16 = dVar16 + dVar13;
      uVar9 = uVar9 + 1;
    }
    if (dVar14 <= dVar13) {
      dVar13 = dVar14;
    }
    pdVar8 = pdVar8 + 5;
    dVar14 = dVar13;
  }
  console::printf("Number of infinite PSNR blocks: %u",uVar6);
  console::printf("Number of non-infinite PSNR blocks: %u",(ulong)uVar9);
  if (uVar9 != 0) {
    auVar3._8_8_ = dVar16;
    auVar3._0_8_ = dVar15;
    auVar12._8_8_ = (double)uVar9;
    auVar12._0_8_ = (double)uVar9;
    auVar12 = divpd(auVar3,auVar12);
    dVar15 = auVar12._8_8_;
    dVar17 = auVar12._0_8_ - dVar15 * dVar15;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",dVar15,dVar17);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i",dVar14,uVar11,uVar10);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",uVar5,uVar4);
    return;
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint /* num_blocks_y */) {
  image_utils::error_metrics best_metrics;
  image_utils::error_metrics worst_metrics;
  worst_metrics.mPeakSNR = 1e+6f;

  vec2I best_loc;
  vec2I worst_loc;
  utils::zero_object(best_loc);
  utils::zero_object(worst_loc);

  double psnr_total = 0.0f;
  double psnr2_total = 0.0f;
  uint num_non_inf = 0;
  uint num_inf = 0;

  for (uint i = 0; i < stats.size(); i++) {
    uint bx = i % num_blocks_x;
    uint by = i / num_blocks_x;

    const image_utils::error_metrics& em = stats[i];

    if ((em.mPeakSNR < 200.0f) && (em > best_metrics)) {
      best_metrics = em;
      best_loc.set(bx, by);
    }
    if (em < worst_metrics) {
      worst_metrics = em;
      worst_loc.set(bx, by);
    }

    if (em.mPeakSNR < 200.0f) {
      psnr_total += em.mPeakSNR;
      psnr2_total += em.mPeakSNR * em.mPeakSNR;
      num_non_inf++;
    } else {
      num_inf++;
    }
  }

  console::printf("Number of infinite PSNR blocks: %u", num_inf);
  console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
  if (num_non_inf) {
    psnr_total /= num_non_inf;
    psnr2_total /= num_non_inf;

    double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
  }
}